

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

int * __thiscall ImVector<int>::erase_unsorted(ImVector<int> *this,int *it)

{
  long lVar1;
  bool bVar2;
  ptrdiff_t off;
  int *it_local;
  ImVector<int> *this_local;
  
  bVar2 = false;
  if (this->Data <= it) {
    bVar2 = it < this->Data + this->Size;
  }
  if (!bVar2) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.h"
                  ,0x71d,"T *ImVector<int>::erase_unsorted(const T *) [T = int]");
  }
  lVar1 = (long)it - (long)this->Data >> 2;
  if (it < this->Data + (long)this->Size + -1) {
    this->Data[lVar1] = this->Data[(long)this->Size + -1];
  }
  this->Size = this->Size + -1;
  return this->Data + lVar1;
}

Assistant:

inline T*           erase_unsorted(const T* it)         { IM_ASSERT(it >= Data && it < Data + Size);  const ptrdiff_t off = it - Data; if (it < Data + Size - 1) memcpy(Data + off, Data + Size - 1, sizeof(T)); Size--; return Data + off; }